

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pystring.cpp
# Opt level: O3

string * pystring::os::path::join_posix
                   (string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *paths)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  void *pvVar4;
  _Alloc_hider _Var5;
  int iVar6;
  int iVar7;
  pointer pbVar8;
  ulong uVar9;
  ulong uVar10;
  char *str;
  Py_ssize_t len;
  char *sub;
  Py_ssize_t slen;
  string b;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar8 = (paths->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (paths->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_58 = paths;
  if (pbVar8 == pbVar1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,empty_string_abi_cxx11_,
               DAT_0010e328 + empty_string_abi_cxx11_);
  }
  else {
    local_60 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_60;
    pcVar2 = (pbVar8->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + pbVar8->_M_string_length);
    if (((long)pbVar1 - (long)pbVar8 != 0x20) &&
       (pbVar8 = (local_58->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,
       0x20 < (ulong)((long)(local_58->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8))) {
      uVar9 = 1;
      uVar10 = 2;
      do {
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        pcVar2 = pbVar8[uVar9]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_80,pcVar2,pcVar2 + pbVar8[uVar9]._M_string_length);
        _Var5._M_p = local_80._M_dataplus._M_p;
        pvVar4 = forward_slash_abi_cxx11_;
        iVar7 = (int)DAT_0010e2a8;
        if (((int)local_80._M_string_length < iVar7) ||
           (iVar6 = bcmp(local_80._M_dataplus._M_p,forward_slash_abi_cxx11_,(long)iVar7), iVar6 != 0
           )) {
          if (((string *)__return_storage_ptr__->_M_string_length == (string *)0x0) ||
             (iVar7 = anon_unknown_1::_string_tailmatch
                                ((string *)(__return_storage_ptr__->_M_dataplus)._M_p,
                                 (string *)__return_storage_ptr__->_M_string_length,
                                 (Py_ssize_t)pvVar4,iVar7,0), iVar7 != 0)) {
            std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)_Var5._M_p);
          }
          else {
            std::operator+(&local_50,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &forward_slash_abi_cxx11_,&local_80);
            std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
          }
        }
        else {
          std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        pbVar8 = (local_58->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        bVar3 = uVar10 < (ulong)((long)(local_58->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >>
                                5);
        uVar9 = uVar10;
        uVar10 = (ulong)((int)uVar10 + 1);
      } while (bVar3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string join_posix(const std::vector< std::string > & paths)
    {
        if(paths.empty()) return empty_string;
        if(paths.size() == 1) return paths[0];
        
        std::string path = paths[0];
        
        for(unsigned int i=1; i<paths.size(); ++i)
        {
            std::string b = paths[i];
            if(pystring::startswith(b, forward_slash))
            {
                path = b;
            }
            else if(path.empty() || pystring::endswith(path, forward_slash))
            {
                path += b;
            }
            else
            {
                path += forward_slash + b;
            }
        }
        
        return path;
    }